

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadMultiTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  bool bVar2;
  void *pvVar3;
  Ref<embree::SceneGraph::Node> *pRVar4;
  runtime_error *this_00;
  size_t sVar5;
  _func_int **pp_Var6;
  size_type sVar7;
  reference pvVar8;
  long *plVar9;
  long lVar10;
  long *in_RDX;
  Node *in_RDI;
  size_t i_10;
  MultiTransformNode *node;
  size_t i_9;
  Ref<embree::SceneGraph::GroupNode> group;
  size_t i_8;
  MultiTransformNode *node_1;
  size_t i_1;
  size_t j;
  avector<avector<AffineSpace3ff>_> spaces;
  avector<AffineSpace3ff> space;
  bool quaternion;
  string str_time_steps;
  int time_steps;
  size_t i_2;
  size_t i_5;
  size_t i_16;
  size_t i_13;
  size_t i_7;
  size_t i_6;
  size_t i_4;
  size_t i_3;
  size_t i;
  size_t i_14;
  size_t i_15;
  size_t i_11;
  size_t i_12;
  Ref<embree::XML> *in_stack_000011a8;
  XMLLoader *in_stack_000011b0;
  size_t *in_stack_fffffffffffff8a8;
  string *in_stack_fffffffffffff8b0;
  GroupNode *in_stack_fffffffffffff8b8;
  size_t in_stack_fffffffffffff8c8;
  GroupNode *in_stack_fffffffffffff8d0;
  undefined1 *puVar11;
  string *in_stack_fffffffffffff8f0;
  undefined7 in_stack_fffffffffffff8f8;
  undefined1 in_stack_fffffffffffff8ff;
  byte bVar12;
  ParseLocation *in_stack_fffffffffffff958;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffff9e0;
  avector<avector<AffineSpace3ff>_> *in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  Ref<embree::XML> *xml_00;
  XMLLoader *in_stack_fffffffffffffa08;
  int local_59c;
  ulong local_568;
  long *local_558;
  _func_int **local_550;
  long *local_548;
  ulong local_540;
  long *local_538;
  undefined4 local_52c;
  ulong local_528;
  undefined1 local_519;
  long *local_518;
  _func_int **local_510;
  undefined1 local_501;
  string local_4e0 [32];
  undefined1 local_4c0 [8];
  ulong local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined1 local_4a0 [8];
  ulong local_498;
  undefined8 local_490;
  undefined8 local_488;
  ulong local_480;
  long local_478;
  Ref<embree::XML> *in_stack_fffffffffffffb90;
  XMLLoader *this_01;
  void *local_458;
  undefined1 local_450 [8];
  ulong local_448;
  undefined8 local_440;
  undefined8 local_438;
  byte local_42d;
  allocator local_419;
  string local_418 [32];
  string local_3f8 [36];
  int local_3d4;
  long *local_3d0;
  long *local_3b8;
  long *local_3b0;
  long *local_3a8;
  long *local_3a0;
  long *local_398;
  long *local_390;
  const_reference local_388;
  long *local_380;
  long *local_378;
  const_reference local_370;
  long *local_368;
  undefined1 *local_358;
  undefined1 *local_350;
  undefined1 *local_340;
  undefined1 *local_330;
  _func_int **local_320;
  _func_int **local_310;
  long **local_300;
  long **local_2f0;
  long **local_2e0;
  long *local_2d0;
  long **local_2c8;
  long **local_2c0;
  long **local_2b8;
  long **local_2b0;
  long *local_2a8;
  long **local_2a0;
  long **local_298;
  int local_288;
  undefined4 local_284;
  XMLLoader *local_280;
  undefined1 *local_278;
  long local_270;
  undefined1 *local_268;
  long local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  Ref<embree::SceneGraph::Node> *local_248;
  undefined1 *local_240;
  void *local_238;
  undefined1 *local_230;
  ulong local_220;
  void *local_218;
  Node *local_210;
  Ref<embree::SceneGraph::Node> *local_208;
  ulong local_1f0;
  undefined1 *local_1e8;
  ulong local_1d0;
  undefined1 *local_1c8;
  ulong local_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined1 *local_190;
  undefined8 local_170;
  undefined8 local_168;
  undefined1 *local_160;
  undefined8 local_140;
  undefined8 local_138;
  undefined1 *local_130;
  Node *local_110;
  Node *local_108;
  Ref<embree::SceneGraph::Node> *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  void *local_e8;
  XMLLoader *local_e0;
  XMLLoader *local_d8;
  undefined1 *local_d0;
  void *local_c8;
  XMLLoader *local_c0;
  undefined1 *local_b8;
  ulong local_70;
  undefined1 *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_3d4 = 1;
  local_3d0 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"time_steps",&local_419);
  XML::parm((XML *)CONCAT17(in_stack_fffffffffffff8ff,in_stack_fffffffffffff8f8),
            in_stack_fffffffffffff8f0);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  bVar2 = std::operator!=(in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
  if (bVar2) {
    local_288 = std::__cxx11::stoi(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,0);
    local_284 = 1;
    local_59c = local_288;
    if (local_288 < 2) {
      local_59c = 1;
    }
    local_3d4 = local_59c;
  }
  local_42d = 0;
  local_358 = local_450;
  local_448 = 0;
  local_440 = 0;
  local_438 = 0;
  local_280 = (XMLLoader *)(long)local_3d4;
  local_278 = &stack0xfffffffffffffb90;
  this_01 = (XMLLoader *)0x0;
  local_458 = (void *)0x0;
  local_d8 = local_280;
  local_d0 = local_278;
  if (local_280 != (XMLLoader *)0x0) {
    local_c0 = local_280;
    local_b8 = local_278;
    local_458 = alignedMalloc((size_t)in_stack_fffffffffffff8b8,(size_t)in_stack_fffffffffffff8b0);
    for (local_e0 = (XMLLoader *)0x0; this_01 = local_d8, local_e0 < local_d8;
        local_e0 = (XMLLoader *)&(local_e0->path).filename.field_0x1) {
      local_c8 = (void *)((long)local_458 + (long)local_e0 * 0x20);
      *(undefined8 *)((long)local_c8 + 8) = 0;
      *(undefined8 *)((long)local_c8 + 0x10) = 0;
      *(undefined8 *)((long)local_c8 + 0x18) = 0;
    }
  }
  local_478 = 0;
  local_480 = 0;
  do {
    if ((ulong)(long)local_3d4 <= local_480) {
      local_3a0 = local_3d0;
      sVar5 = XML::size((XML *)0x3b9395);
      if (sVar5 == (long)(local_3d4 + 1)) {
        pp_Var6 = (_func_int **)SceneGraph::MultiTransformNode::operator_new(0x3b93c7);
        local_519 = 1;
        local_3a8 = local_3d0;
        std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
        operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                   (*local_3d0 + 0x80),(long)local_3d4);
        loadNode(in_stack_000011b0,in_stack_000011a8);
        SceneGraph::MultiTransformNode::MultiTransformNode
                  ((MultiTransformNode *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
        local_519 = 0;
        local_300 = &local_518;
        if (local_518 != (long *)0x0) {
          (**(code **)(*local_518 + 0x18))();
        }
        local_510 = pp_Var6;
        for (local_528 = 0; uVar1 = local_528,
            sVar7 = std::
                    vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                    ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                            *)(local_510 + 0xd)), bVar12 = local_42d, uVar1 < sVar7;
            local_528 = local_528 + 1) {
          pvVar8 = std::
                   vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                 *)(local_510 + 0xd),local_528);
          pvVar8->quaternion = (bool)(bVar12 & 1);
        }
        local_320 = local_510;
        (in_RDI->super_RefCount)._vptr_RefCount = local_510;
        if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
        }
        local_52c = 1;
      }
      else {
        plVar9 = (long *)::operator_new(0x80);
        SceneGraph::GroupNode::GroupNode(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
        local_2c8 = &local_538;
        local_2d0 = plVar9;
        if (plVar9 != (long *)0x0) {
          lVar10 = *local_538;
          local_538 = plVar9;
          (**(code **)(lVar10 + 0x10))();
          plVar9 = local_538;
        }
        local_538 = plVar9;
        local_540 = (ulong)local_3d4;
        while( true ) {
          uVar1 = local_540;
          local_3b0 = local_3d0;
          sVar5 = XML::size((XML *)0x3b9704);
          if (sVar5 <= uVar1) break;
          local_2c0 = &local_538;
          local_3b8 = local_3d0;
          std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
          operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *
                     )(*local_3d0 + 0x80),local_540);
          loadNode(in_stack_000011b0,in_stack_000011a8);
          SceneGraph::GroupNode::add
                    (in_stack_fffffffffffff8b8,
                     (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff8b0);
          local_2f0 = &local_548;
          if (local_548 != (long *)0x0) {
            (**(code **)(*local_548 + 0x18))();
          }
          local_540 = local_540 + 1;
        }
        pp_Var6 = (_func_int **)SceneGraph::MultiTransformNode::operator_new(0x3b98ba);
        local_2b0 = &local_558;
        local_2b8 = &local_538;
        local_2a8 = local_538;
        local_2a0 = &local_558;
        local_558 = local_538;
        if (local_538 != (long *)0x0) {
          (**(code **)(*local_538 + 0x10))();
        }
        SceneGraph::MultiTransformNode::MultiTransformNode
                  ((MultiTransformNode *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
        local_2e0 = &local_558;
        if (local_558 != (long *)0x0) {
          (**(code **)(*local_558 + 0x18))();
        }
        local_550 = pp_Var6;
        for (local_568 = 0;
            sVar7 = std::
                    vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                    ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                            *)(local_550 + 0xd)), local_568 < sVar7; local_568 = local_568 + 1) {
          bVar12 = local_42d;
          pvVar8 = std::
                   vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                 *)(local_550 + 0xd),local_568);
          pvVar8->quaternion = (bool)(bVar12 & 1);
        }
        local_310 = local_550;
        (in_RDI->super_RefCount)._vptr_RefCount = local_550;
        if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
        }
        local_52c = 1;
        local_298 = &local_538;
        if (local_538 != (long *)0x0) {
          (**(code **)(*local_538 + 0x18))();
        }
      }
      puVar11 = &stack0xfffffffffffffb90;
      local_230 = puVar11;
      local_68 = puVar11;
      for (local_70 = 0; local_70 < *(ulong *)(puVar11 + 8); local_70 = local_70 + 1) {
        lVar10 = *(long *)(puVar11 + 0x18) + local_70 * 0x20;
        for (local_58 = 0; local_58 < *(ulong *)(lVar10 + 8); local_58 = local_58 + 1) {
        }
        local_48 = *(undefined8 *)(lVar10 + 0x10);
        local_40 = *(undefined8 *)(lVar10 + 0x18);
        local_60 = lVar10;
        local_50 = lVar10;
        local_38 = lVar10;
        alignedFree(in_stack_fffffffffffff8a8);
        *(undefined8 *)(lVar10 + 0x18) = 0;
        *(undefined8 *)(lVar10 + 0x10) = 0;
        *(undefined8 *)(lVar10 + 8) = 0;
      }
      local_30 = *(undefined8 *)(puVar11 + 0x10);
      local_28 = *(undefined8 *)(puVar11 + 0x18);
      local_20 = puVar11;
      alignedFree(in_stack_fffffffffffff8a8);
      *(undefined8 *)(puVar11 + 0x18) = 0;
      *(undefined8 *)(puVar11 + 0x10) = 0;
      *(undefined8 *)(puVar11 + 8) = 0;
      local_330 = local_450;
      for (local_1f0 = 0; local_1f0 < local_448; local_1f0 = local_1f0 + 1) {
      }
      local_140 = local_440;
      local_138 = local_438;
      local_1e8 = local_330;
      local_130 = local_330;
      alignedFree(in_stack_fffffffffffff8a8);
      local_438 = 0;
      local_440 = 0;
      local_448 = 0;
      std::__cxx11::string::~string(local_3f8);
      return (Ref<embree::SceneGraph::Node>)in_RDI;
    }
    local_368 = local_3d0;
    local_370 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
                operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                            *)(*local_3d0 + 0x80),local_480);
    bVar2 = std::operator==(in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
    if (bVar2) {
      local_378 = local_3d0;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (*local_3d0 + 0x80),local_480);
      loadAffineSpace3faArray(this_01,in_stack_fffffffffffffb90);
      local_258 = &stack0xfffffffffffffb90;
      local_260 = local_478;
      pvVar3 = (void *)((long)local_458 + local_478 * 0x20);
      local_240 = local_4a0;
      for (local_220 = 0; local_220 < *(ulong *)((long)pvVar3 + 8); local_220 = local_220 + 1) {
      }
      local_f8 = *(undefined8 *)((long)pvVar3 + 0x10);
      local_f0 = *(undefined8 *)((long)pvVar3 + 0x18);
      local_478 = local_478 + 1;
      local_238 = pvVar3;
      local_218 = pvVar3;
      local_e8 = pvVar3;
      alignedFree(in_stack_fffffffffffff8a8);
      *(undefined8 *)((long)pvVar3 + 0x18) = 0;
      *(undefined8 *)((long)pvVar3 + 0x10) = 0;
      *(undefined8 *)((long)pvVar3 + 8) = 0;
      *(undefined8 *)((long)pvVar3 + 8) = *(undefined8 *)(local_240 + 8);
      *(undefined8 *)(local_240 + 8) = 0;
      *(undefined8 *)((long)pvVar3 + 0x10) = *(undefined8 *)(local_240 + 0x10);
      *(undefined8 *)(local_240 + 0x10) = 0;
      *(undefined8 *)((long)pvVar3 + 0x18) = *(undefined8 *)(local_240 + 0x18);
      *(undefined8 *)(local_240 + 0x18) = 0;
      local_350 = local_4a0;
      for (local_1b0 = 0; local_1b0 < local_498; local_1b0 = local_1b0 + 1) {
      }
      local_1a0 = local_490;
      local_198 = local_488;
      local_1a8 = local_350;
      local_190 = local_350;
      alignedFree(in_stack_fffffffffffff8a8);
      local_488 = 0;
      local_490 = 0;
      local_498 = 0;
    }
    else {
      local_380 = local_3d0;
      xml_00 = (Ref<embree::XML> *)*local_3d0;
      local_388 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                  ::operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                *)(xml_00 + 0x10),local_480);
      in_stack_fffffffffffff9f7 =
           std::operator==(in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
      if (!(bool)in_stack_fffffffffffff9f7) {
        local_501 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_398 = local_3d0;
        ParseLocation::str_abi_cxx11_(in_stack_fffffffffffff958);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0);
        std::runtime_error::runtime_error(this_00,local_4e0);
        local_501 = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_390 = local_3d0;
      in_stack_fffffffffffff9e8 = (avector<avector<AffineSpace3ff>_> *)*local_3d0;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (in_stack_fffffffffffff9e8 + 4),local_480);
      loadQuaternionArray(in_stack_fffffffffffffa08,xml_00);
      local_268 = &stack0xfffffffffffffb90;
      local_270 = local_478;
      pRVar4 = (Ref<embree::SceneGraph::Node> *)((long)local_458 + local_478 * 0x20);
      local_250 = local_4c0;
      for (local_210 = (Node *)0x0; local_210 < pRVar4[1].ptr;
          local_210 = (Node *)((long)&(local_210->super_RefCount)._vptr_RefCount + 1)) {
      }
      local_110 = pRVar4[2].ptr;
      local_108 = pRVar4[3].ptr;
      in_stack_fffffffffffff9e0 = pRVar4;
      local_478 = local_478 + 1;
      local_248 = pRVar4;
      local_208 = pRVar4;
      local_100 = pRVar4;
      alignedFree(in_stack_fffffffffffff8a8);
      pRVar4[3].ptr = (Node *)0x0;
      pRVar4[2].ptr = (Node *)0x0;
      pRVar4[1].ptr = (Node *)0x0;
      pRVar4[1].ptr = *(Node **)(local_250 + 8);
      *(undefined8 *)(local_250 + 8) = 0;
      pRVar4[2].ptr = *(Node **)(local_250 + 0x10);
      *(undefined8 *)(local_250 + 0x10) = 0;
      pRVar4[3].ptr = *(Node **)(local_250 + 0x18);
      *(undefined8 *)(local_250 + 0x18) = 0;
      local_340 = local_4c0;
      for (local_1d0 = 0; local_1d0 < local_4b8; local_1d0 = local_1d0 + 1) {
      }
      local_170 = local_4b0;
      local_168 = local_4a8;
      local_1c8 = local_340;
      local_160 = local_340;
      alignedFree(in_stack_fffffffffffff8a8);
      local_4a8 = 0;
      local_4b0 = 0;
      local_4b8 = 0;
      local_42d = 1;
    }
    local_480 = local_480 + 1;
  } while( true );
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadMultiTransformNode(const Ref<XML>& xml) 
  {
    /* parse number of time steps to use for instanced geometry */
    int time_steps = 1;
    std::string str_time_steps = xml->parm("time_steps");
    if (str_time_steps != "") time_steps = max(1,std::stoi(str_time_steps));

    bool quaternion = false;
    avector<AffineSpace3ff> space;
    avector<avector<AffineSpace3ff>> spaces(time_steps);
    size_t j = 0;
    for (size_t i=0; i<time_steps; i++) {
      if (xml->children[i]->name == "AffineSpaceArray") {
        spaces[j++] = loadAffineSpace3faArray(xml->children[i]);
      }
      else if (xml->children[i]->name == "QuaternionArray") {
        spaces[j++] = loadQuaternionArray(xml->children[i]);
        quaternion = true;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }
    assert(j == time_steps);

    if (xml->size() == time_steps+1) {
      auto node = new SceneGraph::MultiTransformNode(spaces,loadNode(xml->children[time_steps]));
      for (size_t i = 0; i < node->spaces.size(); ++i) {
        node->spaces[i].quaternion = quaternion;
      }
      return node;
    }

    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=time_steps; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));

    auto node = new  SceneGraph::MultiTransformNode(spaces,group.dynamicCast<SceneGraph::Node>());
    for (size_t i = 0; i < node->spaces.size(); ++i) {
      node->spaces[i].quaternion = quaternion;
    }
    return node;
  }